

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_2misc_reciprocal
               (DisasContext_conflict1 *s,int opcode,_Bool is_scalar,_Bool is_u,_Bool is_q,int size,
               int rn,int rd)

{
  bool bVar1;
  TCGTemp *pTVar2;
  undefined7 in_register_00000009;
  int iVar3;
  TCGv_i64 ret;
  ulong uVar4;
  TCGContext_conflict1 *pTVar5;
  uintptr_t o;
  long lVar6;
  TCGArg a3;
  code *pcVar7;
  undefined7 in_register_00000081;
  undefined1 is_q_00;
  long lVar8;
  TCGArg a3_00;
  TCGTemp *local_88;
  TCGTemp *local_80;
  TCGTemp *local_78;
  TCGContext_conflict1 *local_70;
  TCGTemp *local_68;
  TCGTemp *local_60;
  TCGTemp *local_58;
  long local_50;
  undefined4 local_44;
  TCGv_i64 local_40;
  ulong local_38;
  
  local_78 = (TCGTemp *)CONCAT44(local_78._4_4_,size);
  local_44 = (undefined4)CONCAT71(in_register_00000009,is_u);
  pTVar5 = s->uc->tcg_ctx;
  pTVar2 = tcg_temp_new_internal_aarch64(pTVar5,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)pTVar5);
  tcg_gen_addi_i64_aarch64(pTVar5,ret,(TCGv_i64)pTVar5->cpu_env,0x2ec8);
  local_70 = pTVar5;
  local_40 = ret;
  if ((int)CONCAT71(in_register_00000081,is_q) == 3) {
    lVar8 = 0;
    local_58 = tcg_temp_new_internal_aarch64(pTVar5,TCG_TYPE_I64,false);
    local_50 = (long)local_58 - (long)pTVar5;
    local_60 = tcg_temp_new_internal_aarch64(pTVar5,TCG_TYPE_I64,false);
    lVar6 = (long)local_60 - (long)pTVar5;
    iVar3 = (int)local_78 * 0x100;
    local_68 = (TCGTemp *)((long)pTVar5 + (long)ret);
    local_78 = (TCGTemp *)(long)(rn * 0x100 + 0xc10);
    do {
      pTVar5 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar5,INDEX_op_ld_i64,(long)&pTVar5->pool_cur + local_50,
                          (TCGArg)(pTVar5->cpu_env + (long)pTVar5),
                          ((long)(iVar3 + 0xc00) | 0x10U) + lVar8);
      if (opcode == 0x7d) {
        pcVar7 = helper_rsqrte_f64_aarch64;
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f64_aarch64;
      }
      else {
        if (opcode != 0x3d) {
          iVar3 = 0x26df;
LAB_006b83d1:
          g_assertion_message_expr
                    ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                     ,iVar3,(char *)0x0);
        }
        pcVar7 = helper_recpe_f64_aarch64;
      }
      local_80 = local_68;
      local_88 = local_58;
      tcg_gen_callN_aarch64(local_70,pcVar7,local_60,2,&local_88);
      pTVar5 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar5,INDEX_op_st_i64,(long)pTVar5 + lVar6,
                          (TCGArg)(pTVar5->cpu_env + (long)pTVar5),
                          (TCGArg)(&local_78->field_0x0 + lVar8));
      pTVar5 = local_70;
    } while ((lVar8 == 0) && (lVar8 = 8, !is_scalar));
    tcg_temp_free_internal_aarch64(local_70,(TCGTemp *)(lVar6 + (long)local_70));
    tcg_temp_free_internal_aarch64(pTVar5,(TCGTemp *)((long)&pTVar5->pool_cur + local_50));
    is_q_00 = !is_scalar;
  }
  else {
    local_60 = tcg_temp_new_internal_aarch64(pTVar5,TCG_TYPE_I32,false);
    local_50 = (long)local_60 - (long)pTVar5;
    local_68 = tcg_temp_new_internal_aarch64(pTVar5,TCG_TYPE_I32,false);
    local_58 = (TCGTemp *)((long)local_68 - (long)pTVar5);
    iVar3 = (int)local_78 * 0x100;
    local_78 = (TCGTemp *)(ret + (long)pTVar5);
    a3 = (TCGArg)(rn * 0x100 + 0xc10);
    local_38 = (ulong)(byte)local_44 * 2 + 2;
    a3_00 = (long)(iVar3 + 0xc00) | 0x10;
    uVar4 = 1;
    do {
      pTVar5 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar5,INDEX_op_ld_i32,(long)&pTVar5->pool_cur + local_50,
                          (TCGArg)(pTVar5->cpu_env + (long)pTVar5),a3_00);
      if (opcode < 0x3f) {
        if (opcode == 0x3c) {
          pcVar7 = helper_recpe_u32_aarch64;
        }
        else {
          if (opcode != 0x3d) {
LAB_006b83c5:
            iVar3 = 0x2702;
            goto LAB_006b83d1;
          }
          pcVar7 = helper_recpe_f32_aarch64;
        }
      }
      else if (opcode == 0x3f) {
        pcVar7 = helper_frecpx_f32_aarch64;
      }
      else {
        if (opcode != 0x7d) goto LAB_006b83c5;
        pcVar7 = helper_rsqrte_f32_aarch64;
      }
      local_80 = local_78;
      local_88 = local_60;
      tcg_gen_callN_aarch64(local_70,pcVar7,local_68,2,&local_88);
      if (is_scalar) {
        write_fp_sreg(s,rn,(TCGv_i32)local_58);
        break;
      }
      pTVar5 = s->uc->tcg_ctx;
      tcg_gen_op3_aarch64(pTVar5,INDEX_op_st_i32,
                          (TCGArg)(&local_58->field_0x0 + (long)&pTVar5->pool_cur),
                          (TCGArg)(pTVar5->cpu_env + (long)pTVar5),a3);
      a3_00 = a3_00 + 4;
      a3 = a3 + 4;
      bVar1 = uVar4 < local_38;
      uVar4 = uVar4 + 1;
    } while (bVar1);
    pTVar5 = local_70;
    tcg_temp_free_internal_aarch64
              (local_70,(TCGTemp *)((long)&local_70->pool_cur + (long)&local_58->field_0x0));
    tcg_temp_free_internal_aarch64(pTVar5,(TCGTemp *)((long)&pTVar5->pool_cur + local_50));
    is_q_00 = (undefined1)local_44;
    if (is_scalar) goto LAB_006b8398;
  }
  clear_vec_high(s,(_Bool)is_q_00,rn);
LAB_006b8398:
  tcg_temp_free_internal_aarch64(pTVar5,(TCGTemp *)(local_40 + (long)pTVar5));
  return;
}

Assistant:

static void handle_2misc_reciprocal(DisasContext *s, int opcode,
                                    bool is_scalar, bool is_u, bool is_q,
                                    int size, int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    bool is_double = (size == 3);
    TCGv_ptr fpst = get_fpstatus_ptr(tcg_ctx, false);

    if (is_double) {
        TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
        TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);
        int pass;

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            read_vec_element(s, tcg_op, rn, pass, MO_64);
            switch (opcode) {
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f64(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }
            write_vec_element(s, tcg_res, rd, pass, MO_64);
        }
        tcg_temp_free_i64(tcg_ctx, tcg_res);
        tcg_temp_free_i64(tcg_ctx, tcg_op);
        clear_vec_high(s, !is_scalar, rd);
    } else {
        TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        for (pass = 0; pass < maxpasses; pass++) {
            read_vec_element_i32(s, tcg_op, rn, pass, MO_32);

            switch (opcode) {
            case 0x3c: /* URECPE */
                gen_helper_recpe_u32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3d: /* FRECPE */
                gen_helper_recpe_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x3f: /* FRECPX */
                gen_helper_frecpx_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            case 0x7d: /* FRSQRTE */
                gen_helper_rsqrte_f32(tcg_ctx, tcg_res, tcg_op, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }
        }
        tcg_temp_free_i32(tcg_ctx, tcg_res);
        tcg_temp_free_i32(tcg_ctx, tcg_op);
        if (!is_scalar) {
            clear_vec_high(s, is_q, rd);
        }
    }
    tcg_temp_free_ptr(tcg_ctx, fpst);
}